

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O1

void __thiscall HPreData::makeACopy(HPreData *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,(long)this->numColOriginal,&local_44,&local_45);
  this_00 = &this->Astart;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (this_00,(long)this->numColOriginal + 1,&local_44);
  uVar13 = (uint)((ulong)((long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)(int)uVar13);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)(int)uVar13);
  if (0 < (int)uVar13) {
    piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      iVar8 = piVar2[uVar9];
      if (iVar8 < this->numColOriginal) {
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8] =
             local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar8] + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar9);
  }
  if (0 < this->numColOriginal) {
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = *piVar3;
    lVar11 = 0;
    do {
      iVar8 = iVar8 + local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
      piVar3[lVar11 + 1] = iVar8;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numColOriginal);
  }
  if (0 < this->numColOriginal) {
    piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = piVar2[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numColOriginal);
  }
  if (0 < this->numRowOriginal) {
    piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      lVar12 = (long)piVar2[lVar11];
      lVar10 = lVar11 + 1;
      if (piVar2[lVar11] < piVar2[lVar11 + 1]) {
        piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar8 = piVar4[lVar12];
          if (iVar8 != this->numColOriginal) {
            iVar1 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar8];
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar8] = iVar1 + 1;
            piVar5[iVar1] = (int)lVar11;
            pdVar6[iVar1] = pdVar7[lVar12];
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < piVar2[lVar10]);
      }
      lVar11 = lVar10;
    } while (lVar10 < this->numRowOriginal);
  }
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->Aend,(long)this->numColOriginal + 1,&local_44);
  if (0 < this->numColOriginal) {
    piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      piVar4[lVar11] = piVar2[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numColOriginal);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPreData::makeACopy() {
    // Make a A copy

    int i,k;
    vector<int> iwork(numColOriginal, 0);
    Astart.assign(numColOriginal + 1, 0);
    int AcountX = ARindex.size();
    Aindex.resize(AcountX);
    Avalue.resize(AcountX);
    for (int k = 0; k < AcountX; k++)
    	if (ARindex[k] < numColOriginal)
    		iwork[ARindex[k]]++;
    for (i = 1; i <= numColOriginal; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numColOriginal; i++)
        iwork[i] = Astart[i];
    for (int iRow = 0; iRow < numRowOriginal; iRow++) {
        for (k = ARstart[iRow]; k < ARstart[iRow + 1]; k++) {
            int iColumn = ARindex[k];
            if (iColumn != numColOriginal) {
				int iPut = iwork[iColumn]++;
				Aindex[iPut] = iRow;
				Avalue[iPut] = ARvalue[k];
            }
        }
    }

    Aend.resize(numColOriginal + 1, 0);
    for (i = 0; i < numColOriginal; i++)
        Aend[i] = Astart[i + 1];
}